

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

IdList * sqlite3IdListAppend(Parse *pParse,IdList *pList,Token *pToken)

{
  char *pcVar1;
  int local_34;
  sqlite3 *psStack_30;
  int i;
  sqlite3 *db;
  Token *pToken_local;
  IdList *pList_local;
  Parse *pParse_local;
  
  psStack_30 = pParse->db;
  db = (sqlite3 *)pToken;
  pToken_local = (Token *)pList;
  pList_local = (IdList *)pParse;
  if ((pList == (IdList *)0x0) &&
     (pToken_local = (Token *)sqlite3DbMallocZero(psStack_30,0x10), pToken_local == (Token *)0x0)) {
    pParse_local = (Parse *)0x0;
  }
  else {
    pcVar1 = (char *)sqlite3ArrayAllocate
                               (psStack_30,pToken_local->z,0x10,(int *)&pToken_local->n,&local_34);
    pToken_local->z = pcVar1;
    if (local_34 < 0) {
      sqlite3IdListDelete(psStack_30,(IdList *)pToken_local);
      pParse_local = (Parse *)0x0;
    }
    else {
      pcVar1 = sqlite3NameFromToken(psStack_30,(Token *)db);
      *(char **)(pToken_local->z + (long)local_34 * 0x10) = pcVar1;
      if ((1 < (byte)pList_local[0x10].field_0xc) &&
         (*(long *)(pToken_local->z + (long)local_34 * 0x10) != 0)) {
        sqlite3RenameTokenMap
                  ((Parse *)pList_local,*(void **)(pToken_local->z + (long)local_34 * 0x10),
                   (Token *)db);
      }
      pParse_local = (Parse *)pToken_local;
    }
  }
  return (IdList *)pParse_local;
}

Assistant:

SQLITE_PRIVATE IdList *sqlite3IdListAppend(Parse *pParse, IdList *pList, Token *pToken){
  sqlite3 *db = pParse->db;
  int i;
  if( pList==0 ){
    pList = sqlite3DbMallocZero(db, sizeof(IdList) );
    if( pList==0 ) return 0;
  }
  pList->a = sqlite3ArrayAllocate(
      db,
      pList->a,
      sizeof(pList->a[0]),
      &pList->nId,
      &i
  );
  if( i<0 ){
    sqlite3IdListDelete(db, pList);
    return 0;
  }
  pList->a[i].zName = sqlite3NameFromToken(db, pToken);
  if( IN_RENAME_OBJECT && pList->a[i].zName ){
    sqlite3RenameTokenMap(pParse, (void*)pList->a[i].zName, pToken);
  }
  return pList;
}